

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.cpp
# Opt level: O0

void __thiscall sf2cute::RIFF::set_name(RIFF *this,string *name)

{
  long lVar1;
  ostream *poVar2;
  invalid_argument *this_00;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream message_builder;
  string *name_local;
  RIFF *this_local;
  
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 4) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar2 = std::operator<<((ostream *)local_190,"Invalid RIFF form type \"");
    poVar2 = std::operator<<(poVar2,(string *)name);
    std::operator<<(poVar2,"\".");
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(this_00,local_1c0);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::operator=((string *)&this->name_,(string *)name);
  return;
}

Assistant:

void RIFF::set_name(std::string name) {
  // Throw exception if the length of form type is not 4.
  if (name.size() != 4) {
    std::ostringstream message_builder;
    message_builder << "Invalid RIFF form type \"" << name << "\".";
    throw std::invalid_argument(message_builder.str());
  }

  // Set the name.
  name_ = std::move(name);
}